

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8to1,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  int i_3;
  int q_2;
  short *g00_1;
  int k_1;
  Mat g0_1;
  Mat k0_1;
  short *k00;
  int j_1;
  int i_2;
  int q_1;
  short *g00;
  int k;
  Mat g0;
  int p;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [6] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p_1;
  short ktm [6] [3];
  Mat kernel_tm;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff7e0;
  int _elempack;
  void **ppvVar2;
  size_t in_stack_fffffffffffff7e8;
  undefined8 in_stack_fffffffffffff7f0;
  int _c;
  undefined8 in_stack_fffffffffffff7f8;
  Mat *in_stack_fffffffffffff800;
  Allocator *in_stack_fffffffffffff860;
  int local_740;
  int local_73c;
  undefined2 *local_738;
  int local_72c;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined4 local_710;
  long local_708;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  long *local_6c0;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined4 local_680;
  long *local_678;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined8 local_658;
  void *local_650;
  int local_644;
  int local_640;
  int local_63c;
  undefined2 *local_638;
  int local_62c;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined4 local_610;
  long local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined8 local_5e8;
  int local_5e0;
  int local_5dc;
  short *local_5d8;
  int local_5d0;
  int local_5cc;
  short local_5c8 [20];
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined4 local_560;
  long *local_558;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined8 local_538;
  void *local_530;
  char *local_528;
  int local_520;
  int local_51c;
  short local_518 [24];
  void *local_4e8;
  int *local_4e0;
  long local_4d8;
  undefined4 local_4d0;
  long *local_4c8;
  undefined4 local_4c0;
  int local_4bc;
  int local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  long local_4a8;
  int local_498;
  int local_494;
  long *local_490;
  long *local_488;
  undefined1 local_47d;
  int local_47c;
  undefined8 *local_470;
  undefined1 local_465;
  int local_464;
  void **local_460;
  undefined8 *local_458;
  undefined1 local_44d;
  int local_44c;
  void **local_448;
  undefined8 *local_440;
  undefined1 local_435;
  int local_434;
  undefined8 *local_428;
  undefined1 local_41d;
  int local_41c;
  void **local_418;
  undefined8 *local_410;
  undefined8 *local_3e0;
  undefined8 *local_3d0;
  undefined8 *local_3c0;
  undefined8 *local_3b0;
  undefined8 *local_3a0;
  void **local_390;
  long *local_378;
  undefined4 local_36c;
  long local_368;
  void *local_360;
  undefined4 local_354;
  int local_350;
  int local_34c;
  undefined8 *local_348;
  long local_340;
  undefined4 local_334;
  long local_330;
  long local_328;
  undefined4 local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  long *local_308;
  undefined4 local_2fc;
  long local_2f8;
  void *local_2f0;
  undefined4 local_2e4;
  int local_2e0;
  int local_2dc;
  undefined8 *local_2d8;
  long *local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  void *local_2b8;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  long local_298;
  undefined4 local_28c;
  long local_288;
  long local_280;
  undefined4 local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  undefined4 local_25c;
  long local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  int local_200;
  undefined4 local_1fc;
  void **local_1f8;
  undefined8 *local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_198;
  undefined8 *local_178;
  undefined8 *local_158;
  void *local_88;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_5c;
  void **local_58;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined8 *local_38;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20);
  local_58 = &local_4e8;
  local_5c = 0x24;
  local_70 = 2;
  local_78 = 0;
  local_4e8 = (void *)0x0;
  local_4e0 = (int *)0x0;
  local_4d8 = 0;
  local_4d0 = 0;
  local_4c8 = (long *)0x0;
  local_4c0 = 0;
  local_4bc = 0;
  local_4b8 = 0;
  local_4b4 = 0;
  local_4b0 = 0;
  local_4a8 = 0;
  local_498 = in_ECX;
  local_494 = in_EDX;
  local_490 = in_RSI;
  local_488 = in_RDI;
  Mat::create(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
              (int)in_stack_fffffffffffff7f8,_c,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
  memcpy(local_518,&DAT_01c76980,0x24);
  for (local_51c = 0; local_51c < local_498; local_51c = local_51c + 1) {
    for (local_520 = 0; local_520 < local_494; local_520 = local_520 + 1) {
      local_590 = (char *)(*local_488 + (long)(local_51c * local_494 * 9) + (long)(local_520 * 9));
      local_410 = &local_578;
      local_418 = &local_4e8;
      local_360 = (void *)((long)local_4e8 + local_4a8 * local_51c * local_4d8);
      local_348 = &local_578;
      local_218 = (long)local_4bc * (long)local_4b8 * local_4d8;
      local_558 = local_4c8;
      local_21c = 0x10;
      local_34c = local_4bc;
      local_350 = local_4b8;
      local_354 = local_4b4;
      local_368 = local_4d8;
      local_36c = local_4d0;
      local_378 = local_4c8;
      local_41c = local_51c;
      local_41d = 1;
      local_28 = &local_578;
      local_2c = local_520;
      local_530 = (void *)((long)local_360 + (long)local_4bc * (long)local_520 * local_4d8);
      local_3e0 = &local_578;
      local_578 = 0;
      local_568 = 0;
      local_560 = 0;
      local_550 = 0;
      local_54c = 0;
      local_548 = 0;
      local_544 = 0;
      local_540 = 0;
      local_538 = 0;
      local_570 = 0;
      local_598 = local_590 + 3;
      local_5a0 = local_590 + 6;
      for (local_5cc = 0; local_5cc < 6; local_5cc = local_5cc + 1) {
        local_5c8[(long)local_5cc * 3] =
             (short)*local_590 * local_518[(long)local_5cc * 3] +
             (short)local_590[1] * local_518[(long)local_5cc * 3 + 1] +
             (short)local_590[2] * local_518[(long)local_5cc * 3 + 2];
        local_5c8[(long)local_5cc * 3 + 1] =
             (short)*local_598 * local_518[(long)local_5cc * 3] +
             (short)local_590[4] * local_518[(long)local_5cc * 3 + 1] +
             (short)local_590[5] * local_518[(long)local_5cc * 3 + 2];
        local_5c8[(long)local_5cc * 3 + 2] =
             (short)*local_5a0 * local_518[(long)local_5cc * 3] +
             (short)local_590[7] * local_518[(long)local_5cc * 3 + 1] +
             (short)local_590[8] * local_518[(long)local_5cc * 3 + 2];
      }
      for (local_5d0 = 0; local_5d0 < 6; local_5d0 = local_5d0 + 1) {
        lVar1 = (long)local_5d0;
        local_5d8 = local_5c8 + lVar1 * 3;
        for (local_5dc = 0; local_5dc < 6; local_5dc = local_5dc + 1) {
          *(short *)((long)local_530 + (long)(local_5d0 * 6 + local_5dc) * 2) =
               *local_5d8 * local_518[(long)local_5dc * 3] +
               local_5c8[lVar1 * 3 + 1] * local_518[(long)local_5dc * 3 + 1] +
               local_5c8[lVar1 * 3 + 2] * local_518[(long)local_5dc * 3 + 2];
        }
      }
      local_528 = local_590;
      local_158 = local_3e0;
    }
  }
  Mat::create(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
              (int)in_stack_fffffffffffff7f8,_c,in_stack_fffffffffffff7e8,_elempack,
              in_stack_fffffffffffff860);
  for (local_5e0 = 0; local_5e0 + 3 < local_498; local_5e0 = local_5e0 + 4) {
    local_434 = local_5e0 / 4;
    local_428 = &local_628;
    local_314 = *(int *)((long)local_490 + 0x2c);
    local_318 = (int)local_490[6];
    local_31c = *(undefined4 *)((long)local_490 + 0x34);
    local_328 = *local_490 + local_490[8] * (long)local_434 * local_490[2];
    local_330 = local_490[2];
    local_334 = (undefined4)local_490[3];
    local_340 = local_490[4];
    local_310 = &local_628;
    local_228 = (long)local_314 * (long)local_318 * local_330;
    local_22c = 0x10;
    local_435 = 1;
    for (local_62c = 0; local_62c < 0x24; local_62c = local_62c + 1) {
      local_38 = &local_628;
      local_3c = local_62c;
      local_638 = (undefined2 *)(local_328 + (long)local_314 * (long)local_62c * local_330);
      for (local_63c = 0; local_63c + 7 < local_494; local_63c = local_63c + 8) {
        for (local_640 = 0; local_640 < 4; local_640 = local_640 + 1) {
          for (local_644 = 0; local_644 < 8; local_644 = local_644 + 1) {
            local_44c = local_5e0 + local_640;
            local_440 = &local_698;
            local_448 = &local_4e8;
            local_2f0 = (void *)((long)local_4e8 + local_4a8 * local_44c * local_4d8);
            local_2d8 = &local_698;
            local_678 = local_4c8;
            local_238 = (long)local_4bc * (long)local_4b8 * local_4d8;
            local_23c = 0x10;
            local_2dc = local_4bc;
            local_2e0 = local_4b8;
            local_2e4 = local_4b4;
            local_2f8 = local_4d8;
            local_2fc = local_4d0;
            local_308 = local_4c8;
            local_44d = 1;
            local_1c = local_63c + local_644;
            local_18 = &local_698;
            local_650 = (void *)((long)local_2f0 + (long)local_4bc * (long)local_1c * local_4d8);
            local_3d0 = &local_698;
            local_698 = 0;
            local_688 = 0;
            local_680 = 0;
            local_670 = 0;
            local_66c = 0;
            local_668 = 0;
            local_664 = 0;
            local_660 = 0;
            local_658 = 0;
            local_690 = 0;
            *local_638 = *(undefined2 *)((long)local_650 + (long)local_62c * 2);
            local_638 = local_638 + 1;
            local_178 = local_3d0;
          }
        }
      }
    }
    local_3c0 = &local_628;
    local_628 = 0;
    local_618 = 0;
    local_610 = 0;
    local_600 = 0;
    local_5fc = 0;
    local_5f8 = 0;
    local_5f4 = 0;
    local_5f0 = 0;
    local_5e8 = 0;
    local_620 = 0;
    local_198 = local_3c0;
    local_608 = local_340;
  }
  for (; local_5e0 < local_498; local_5e0 = local_5e0 + 1) {
    local_458 = &local_6e0;
    local_460 = &local_4e8;
    local_2b8 = (void *)((long)local_4e8 + local_4a8 * local_5e0 * local_4d8);
    local_2a0 = &local_6e0;
    local_248 = (long)local_4bc * (long)local_4b8 * local_4d8;
    local_47c = local_5e0 / 4 + local_5e0 % 4;
    local_470 = &local_728;
    local_26c = *(int *)((long)local_490 + 0x2c);
    local_270 = (int)local_490[6];
    local_274 = *(undefined4 *)((long)local_490 + 0x34);
    local_280 = *local_490 + local_490[8] * (long)local_47c * local_490[2];
    local_288 = local_490[2];
    local_28c = (undefined4)local_490[3];
    local_298 = local_490[4];
    local_268 = &local_728;
    local_258 = (long)local_26c * (long)local_270 * local_288;
    for (local_72c = 0; local_72c < 0x24; local_72c = local_72c + 1) {
      local_48 = &local_728;
      local_4c = local_72c;
      local_738 = (undefined2 *)(local_280 + (long)local_26c * (long)local_72c * local_288);
      for (local_73c = 0; local_73c + 7 < local_494; local_73c = local_73c + 8) {
        for (local_740 = 0; local_740 < 8; local_740 = local_740 + 1) {
          local_c = local_73c + local_740;
          local_8 = &local_6e0;
          *local_738 = *(undefined2 *)
                        ((long)local_2b8 +
                        (long)local_72c * 2 + (long)local_4bc * (long)local_c * local_4d8);
          local_738 = local_738 + 1;
        }
      }
    }
    local_3b0 = &local_728;
    local_728 = 0;
    local_718 = 0;
    local_710 = 0;
    local_700 = 0;
    local_6fc = 0;
    local_6f8 = 0;
    local_6f4 = 0;
    local_6f0 = 0;
    local_6e8 = 0;
    local_720 = 0;
    local_3a0 = &local_6e0;
    local_6c0 = local_4c8;
    local_24c = 0x10;
    local_25c = 0x10;
    local_2a4 = local_4bc;
    local_2a8 = local_4b8;
    local_2ac = local_4b4;
    local_2c0 = local_4d8;
    local_2c4 = local_4d0;
    local_2d0 = local_4c8;
    local_464 = local_5e0;
    local_465 = 1;
    local_47d = 1;
    local_6e0 = 0;
    local_6d0 = 0;
    local_6c8 = 0;
    local_6b8 = 0;
    local_6b4 = 0;
    local_6b0 = 0;
    local_6ac = 0;
    local_6a8 = 0;
    local_6a0 = 0;
    local_6d8 = 0;
    local_1d8 = local_3a0;
    local_1b8 = local_3b0;
    local_708 = local_298;
  }
  ppvVar2 = &local_4e8;
  if (local_4e0 != (int *)0x0) {
    local_1fc = 0xffffffff;
    LOCK();
    local_200 = *local_4e0;
    *local_4e0 = *local_4e0 + -1;
    UNLOCK();
    if (local_200 == 1) {
      local_390 = ppvVar2;
      local_1f8 = ppvVar2;
      if (local_4c8 == (long *)0x0) {
        local_88 = local_4e8;
        if (local_4e8 != (void *)0x0) {
          free(local_4e8);
        }
      }
      else {
        (**(code **)(*local_4c8 + 0x18))(local_4c8,local_4e8);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8to1, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx512vnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avxvnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8to1.create(8 * inch / 8, 36, outch / 4 + outch % 4, (size_t)2u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        Mat g0 = kernel_tm_pack8to1.channel(p / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const short* k00 = kernel_tm.channel(p + i).row<const short>(q + j);
                        g00[0] = k00[k];
                        g00 += 1;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4 + p % 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];

                    g00 += 1;
                }
            }
        }
    }
}